

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O2

void __thiscall Assimp::LWOImporter::LoadLWO2ImageMap(LWOImporter *this,uint size,Texture *tex)

{
  uint8_t **outFile;
  ushort uVar1;
  uint *puVar2;
  uint uVar3;
  uint32_t uVar4;
  SubChunkHeader SVar5;
  DeadlyImportError *this_00;
  uint8_t *puVar6;
  uint8_t *puVar7;
  allocator<char> local_51;
  string local_50;
  
  outFile = &this->mFileBuffer;
  puVar6 = this->mFileBuffer;
  puVar7 = puVar6 + size;
  while( true ) {
    if (puVar7 <= puVar6 + 6) {
      return;
    }
    SVar5 = IFF::LoadSubChunk(outFile);
    puVar2 = (uint *)*outFile;
    puVar6 = (uint8_t *)(((ulong)SVar5 >> 0x20 & 0xffff) + (long)puVar2);
    if (puVar7 < puVar6) break;
    uVar4 = SVar5.type;
    if (uVar4 == 0x41584953) {
      uVar3 = *puVar2;
      *outFile = (uint8_t *)((long)puVar2 + 2);
      tex->majorAxis = (uint)(ushort)((ushort)uVar3 << 8 | (ushort)uVar3 >> 8);
    }
    else if (uVar4 == 0x494d4147) {
      uVar3 = *puVar2;
      *outFile = (uint8_t *)((long)puVar2 + 2);
      tex->mClipIdx = (uint)(ushort)((ushort)uVar3 << 8 | (ushort)uVar3 >> 8);
    }
    else if (uVar4 == 0x57525057) {
      uVar3 = *puVar2;
      *outFile = (uint8_t *)(puVar2 + 1);
      tex->wrapAmountW =
           (float)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18);
    }
    else if (uVar4 == 0x564d4150) {
      GetS0(this,&tex->mUVChannelIndex,SVar5._4_4_ & 0xffff);
    }
    else if (uVar4 == 0x57524150) {
      uVar3 = *puVar2;
      *outFile = (uint8_t *)((long)puVar2 + 2);
      tex->wrapModeWidth = (uint)(ushort)((ushort)uVar3 << 8 | (ushort)uVar3 >> 8);
      uVar1 = *(ushort *)*outFile;
      *outFile = (uint8_t *)((long)*outFile + 2);
      tex->wrapModeHeight = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
    }
    else if (uVar4 == 0x57525048) {
      uVar3 = *puVar2;
      *outFile = (uint8_t *)(puVar2 + 1);
      tex->wrapAmountH =
           (float)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18);
    }
    else if (uVar4 == 0x50524f4a) {
      uVar3 = *puVar2;
      *outFile = (uint8_t *)((long)puVar2 + 2);
      tex->mapMode = (uint)(ushort)((ushort)uVar3 << 8 | (ushort)uVar3 >> 8);
    }
    *outFile = puVar6;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"LWO2: Invalid SURF.BLOCK chunk length",&local_51);
  DeadlyImportError::DeadlyImportError(this_00,&local_50);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LWOImporter::LoadLWO2ImageMap(unsigned int size, LWO::Texture& tex )
{
    LE_NCONST uint8_t* const end = mFileBuffer + size;
    while (true)
    {
        if (mFileBuffer + 6 >= end)break;
        LE_NCONST IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
            throw DeadlyImportError("LWO2: Invalid SURF.BLOCK chunk length");

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
        case AI_LWO_PROJ:
            tex.mapMode = (Texture::MappingMode)GetU2();
            break;
        case AI_LWO_WRAP:
            tex.wrapModeWidth  = (Texture::Wrap)GetU2();
            tex.wrapModeHeight = (Texture::Wrap)GetU2();
            break;
        case AI_LWO_AXIS:
            tex.majorAxis = (Texture::Axes)GetU2();
            break;
        case AI_LWO_IMAG:
            tex.mClipIdx = GetU2();
            break;
        case AI_LWO_VMAP:
            GetS0(tex.mUVChannelIndex,head.length);
            break;
        case AI_LWO_WRPH:
            tex.wrapAmountH = GetF4();
            break;
        case AI_LWO_WRPW:
            tex.wrapAmountW = GetF4();
            break;
        }
        mFileBuffer = next;
    }
}